

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::HL1MDLLoader
          (HL1MDLLoader *this,aiScene *scene,IOSystem *io,uchar *buffer,string *file_path,
          HL1ImportSettings *import_settings)

{
  this->scene_ = scene;
  this->io_ = io;
  this->buffer_ = buffer;
  this->file_path_ = file_path;
  this->import_settings_ = import_settings;
  this->header_ = (Header_HL1 *)0x0;
  this->texture_header_ = (Header_HL1 *)0x0;
  this->anim_headers_ = (SequenceHeader_HL1 **)0x0;
  this->texture_buffer_ = (uchar *)0x0;
  *(undefined8 *)((long)&this->texture_buffer_ + 4) = 0;
  *(undefined8 *)((long)&this->anim_buffers_ + 4) = 0;
  (this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniqueNameGenerator::UniqueNameGenerator(&this->unique_name_generator_);
  (this->temp_bones_).
  super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->num_blend_controllers_ = 0;
  this->total_models_ = 0;
  (this->temp_bones_).
  super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->temp_bones_).
  super__Vector_base<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone,_std::allocator<Assimp::MDL::HalfLife::HL1MDLLoader::TempBone>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unique_sequence_groups_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unique_sequence_groups_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unique_sequence_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unique_sequence_groups_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unique_sequence_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unique_sequence_names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  load_file(this);
  return;
}

Assistant:

HL1MDLLoader::HL1MDLLoader(
    aiScene *scene,
    IOSystem *io,
    const unsigned char *buffer,
    const std::string &file_path,
    const HL1ImportSettings &import_settings) :
    scene_(scene),
    io_(io),
    buffer_(buffer),
    file_path_(file_path),
    import_settings_(import_settings),
    header_(nullptr),
    texture_header_(nullptr),
    anim_headers_(nullptr),
    texture_buffer_(nullptr),
    anim_buffers_(nullptr),
    num_sequence_groups_(0),
    rootnode_children_(),
    unique_name_generator_(),
    unique_sequence_names_(),
    unique_sequence_groups_names_(),
    temp_bones_(),
    num_blend_controllers_(0),
    total_models_(0) {
    load_file();
}